

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionPrimitves.hpp
# Opt level: O2

TypedTermList __thiscall Kernel::SelectedEquality::biggerSide(SelectedEquality *this)

{
  TermList TVar1;
  TypedTermList TVar2;
  
  TVar2.super_TermList._content =
       Lib::
       Coproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>
       ::
       match<Kernel::SelectedEquality::biggerSide()const::_lambda(Kernel::SelectedSummand_const&)_1_,Kernel::SelectedEquality::biggerSide()const::_lambda(Kernel::SelectedIntegerEquality_const&)_1_,Kernel::SelectedEquality::biggerSide()const::_lambda(Kernel::SelectedUninterpretedEquality_const&)_1_>
                 ();
  TVar1 = SortHelper::getEqualityArgumentSort
                    (*(Literal **)
                      (*(long *)(this->_inner)._inner.
                                super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
                                .
                                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
                                .
                                super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
                                ._content + 0x70 +
                      (long)*(int *)((this->_inner)._inner.
                                     super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
                                     .
                                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
                                     .
                                     super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
                                     ._content + 8) * 8));
  TVar2._sort._content = TVar1._content;
  return TVar2;
}

Assistant:

TypedTermList biggerSide() const 
    { return TypedTermList(
        _inner.match(
          [](SelectedSummand               const& x) { return x.selectedAtom(); },
          [](SelectedIntegerEquality       const& x) { return x.biggerSide(); },
          [](SelectedUninterpretedEquality const& x) { return x.biggerSide(); }), 
        SortHelper::getEqualityArgumentSort(literal())); }